

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  char c;
  bool bVar1;
  
  if ((p == (char *)0x0) || (c = *p, c == '\0')) {
    p = (char *)0x0;
  }
  else {
    if (encoding == TIXML_ENCODING_UTF8) {
      do {
        if (c == -0x11) {
          if (p[1] != -0x41) {
            if (p[1] == -0x45) goto LAB_0010e76d;
            goto LAB_0010e779;
          }
          if (p[2] != -0x42) {
LAB_0010e76d:
            if (p[2] != -0x41) goto LAB_0010e779;
          }
          p = p + 3;
        }
        else {
          if (c == '\0') {
            return p;
          }
LAB_0010e779:
          bVar1 = IsWhiteSpace(c);
          p = p + bVar1;
          if (!bVar1) {
            return p;
          }
        }
        c = *p;
      } while( true );
    }
    while ((c != '\0' && (bVar1 = IsWhiteSpace(c), bVar1))) {
      c = p[1];
      p = p + 1;
    }
  }
  return p;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace( const char* p, TiXmlEncoding encoding )
{
	if ( !p || !*p )
	{
		return 0;
	}
	if ( encoding == TIXML_ENCODING_UTF8 )
	{
		while ( *p )
		{
			const unsigned char* pU = (const unsigned char*)p;
			
			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (	*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==TIXML_UTF_LEAD_1 
				 && *(pU+2)==TIXML_UTF_LEAD_2 )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbeU )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbfU )
			{
				p += 3;
				continue;
			}

			if ( IsWhiteSpace( *p ) )		// Still using old rules for white space.
				++p;
			else
				break;
		}
	}
	else
	{
		while ( *p && IsWhiteSpace( *p ) )
			++p;
	}

	return p;
}